

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

bool __thiscall
kratos::RemovePassThroughVisitor::is_pass_through
          (RemovePassThroughVisitor *this,Generator *generator)

{
  long lVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __node_base _Var3;
  int iVar4;
  iterator iVar5;
  undefined4 extraout_var;
  _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *__ht;
  _Rb_tree_node_base *p_Var6;
  GeneratorException *this_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  bool bVar7;
  bool bVar8;
  string_view format_str;
  format_args args;
  initializer_list<kratos::IRNode_*> __l;
  undefined1 local_d0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vars;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  undefined1 local_80 [8];
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  sinks;
  undefined1 local_40 [8];
  shared_ptr<kratos::Port> port;
  undefined4 extraout_var_00;
  
  if (generator->is_cloned_ == true) {
    local_d0 = (undefined1  [8])generator->def_instance_;
    if (local_d0 == (undefined1  [8])0x0) {
      this_01 = (GeneratorException *)__cxa_allocate_exception(0x10);
      vars.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(generator->instance_name)._M_dataplus._M_p;
      port_names._M_t._M_impl._0_8_ = (generator->instance_name)._M_string_length;
      format_str.size_ = 0xd;
      format_str.data_ = (char *)0x2b;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)
               &vars.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)local_80,(detail *)"{0} is cloned but doesn\'t have def instance",
                 format_str,args);
      __l._M_len = 1;
      __l._M_array = (iterator)local_40;
      local_40 = (undefined1  [8])generator;
      std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                ((vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                 &vars.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,__l,
                 (allocator_type *)&sinks._M_h._M_single_bucket);
      GeneratorException::GeneratorException
                (this_01,(string *)local_80,
                 (vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> *)
                 &vars.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __cxa_throw(this_01,&GeneratorException::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar5 = std::
            _Hashtable<kratos::Generator_*,_kratos::Generator_*,_std::allocator<kratos::Generator_*>,_std::__detail::_Identity,_std::equal_to<kratos::Generator_*>,_std::hash<kratos::Generator_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&(this->pass_through_)._M_h,(key_type *)local_d0);
    bVar7 = iVar5.super__Node_iterator_base<kratos::Generator_*,_false>._M_cur != (__node_type *)0x0
    ;
  }
  else {
    Generator::get_vars_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d0,generator);
    if (local_d0 ==
        (undefined1  [8])
        vars.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&vars.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,&(generator->ports_)._M_t);
      if ((((ulong)port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right & 1) == 0) &&
         ((long)(generator->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(generator->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4 ==
          (ulong)port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right >> 1)) {
        bVar7 = true;
        for (p_Var6 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var6 != (_Rb_tree_node_base *)&port_names;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          Generator::get_port((Generator *)local_40,(string *)generator);
          if (*(int *)&((IRNode *)((long)local_40 + 0x270))->_vptr_IRNode == 0) {
            iVar4 = (*(*(_func_int ***)local_40)[0xe])();
            __ht = (_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)CONCAT44(extraout_var_00,iVar4);
            local_80 = (undefined1  [8])0x0;
            sinks._M_h._M_buckets = (__buckets_ptr)__ht->_M_bucket_count;
            sinks._M_h._M_bucket_count = 0;
            sinks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)__ht->_M_element_count;
            sinks._M_h._M_element_count = *(size_type *)&__ht->_M_rehash_policy;
            sinks._M_h._M_rehash_policy._0_8_ = (__ht->_M_rehash_policy)._M_next_resize;
            sinks._M_h._M_rehash_policy._M_next_resize = 0;
            sinks._M_h._M_single_bucket = (__node_base_ptr)local_80;
            std::
            _Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_assign<std::_Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::shared_ptr<kratos::AssignStmt>,false>>>>
                      ((_Hashtable<std::shared_ptr<kratos::AssignStmt>,std::shared_ptr<kratos::AssignStmt>,std::allocator<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<kratos::AssignStmt>>,std::hash<std::shared_ptr<kratos::AssignStmt>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_80,__ht,
                       (_AllocNode<std::allocator<std::__detail::_Hash_node<std::shared_ptr<kratos::AssignStmt>,_false>_>_>
                        *)&sinks._M_h._M_single_bucket);
            _Var3._M_nxt = sinks._M_h._M_before_begin._M_nxt;
            std::
            _Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable((_Hashtable<std::shared_ptr<kratos::AssignStmt>,_std::shared_ptr<kratos::AssignStmt>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Identity,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                           *)local_80);
            bVar8 = _Var3._M_nxt == (_Hash_node_base *)0x1;
LAB_001f0eb9:
            if (!bVar8) {
LAB_001f0ee3:
              if (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ;
              }
              goto LAB_001f0ef1;
            }
          }
          else {
            iVar4 = (*(*(_func_int ***)local_40)[0x10])();
            if (*(long *)(CONCAT44(extraout_var,iVar4) + 0x18) != 1) goto LAB_001f0ee3;
            lVar1 = *(long *)(CONCAT44(extraout_var,iVar4) + 0x10);
            lVar2 = *(long *)(lVar1 + 8);
            this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x10);
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_00->_M_use_count = this_00->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_00->_M_use_count = this_00->_M_use_count + 1;
              }
              iVar4 = *(int *)(*(long *)(lVar2 + 200) + 0x168);
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              bVar8 = iVar4 == 4;
              goto LAB_001f0eb9;
            }
            if (*(int *)(*(long *)(lVar2 + 200) + 0x168) != 4) goto LAB_001f0ee3;
          }
          if (port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       port.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
        }
      }
      else {
LAB_001f0ef1:
        bVar7 = false;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&vars.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      bVar7 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_d0);
  }
  return bVar7;
}

Assistant:

bool is_pass_through(Generator* generator) {
        if (generator->is_cloned()) {
            auto* ref_gen = generator->def_instance();
            if (!ref_gen) {
                throw GeneratorException(::format("{0} is cloned but doesn't have def instance",
                                                  generator->instance_name),
                                         {generator});
            }
            return pass_through_.find(ref_gen) != pass_through_.end();
        }
        const auto vars = generator->get_vars();
        // has to be empty
        if (!vars.empty()) return false;
        // has to have exact number of assignments as ports
        // ports has to be an even number, i.e. one in to one out
        // maybe we can relax this restriction later
        auto const port_names = generator->get_port_names();
        if (port_names.size() % 2) return false;
        if (generator->stmts_count() != port_names.size() / 2) return false;

        // NOLINTNEXTLINE
        for (const auto& port_name : port_names) {
            auto const port = generator->get_port(port_name);
            if (port->port_direction() == PortDirection::In) {
                auto sinks = port->sinks();
                if (sinks.size() != 1) return false;
            } else {
                auto const& sources = port->sources();
                if (sources.size() != 1) return false;
                // maybe some add stuff
                auto stmt = *(sources.begin());
                auto* src = stmt->right();
                if (src->type() != VarType::PortIO) return false;
            }
        }
        return true;
    }